

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

void oonf_log(oonf_log_severity severity,oonf_log_source source,char *file,int line,void *hexptr,
             size_t hexlen,char *format,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1d8 [48];
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_120;
  undefined8 local_118;
  list_entity *__tempptr_3;
  list_entity *local_108;
  list_entity *__tempptr_2;
  list_entity *local_f8;
  list_entity *__tempptr_1;
  list_entity *local_e8;
  list_entity *__tempptr;
  int p2;
  int p1;
  va_list ap;
  char *last;
  oonf_walltime_str tbuf;
  oonf_log_parameters param;
  oonf_log_handler_entry *iterator;
  oonf_log_handler_entry *h;
  size_t hexlen_local;
  void *hexptr_local;
  int line_local;
  char *file_local;
  oonf_log_source source_local;
  oonf_log_severity severity_local;
  
  if (in_AL != '\0') {
    local_1a8 = in_XMM0_Qa;
    local_198 = in_XMM1_Qa;
    local_188 = in_XMM2_Qa;
    local_178 = in_XMM3_Qa;
    local_168 = in_XMM4_Qa;
    local_158 = in_XMM5_Qa;
    local_148 = in_XMM6_Qa;
    local_138 = in_XMM7_Qa;
  }
  __tempptr._4_4_ = 0;
  __tempptr._0_4_ = 0;
  if (severity == LOG_SEVERITY_WARN) {
    _log_warnings[source] = _log_warnings[source] + 1;
    _log_warnings[0] = _log_warnings[0] + 1;
  }
  ap[0].overflow_arg_area = local_1d8;
  ap[0]._0_8_ = &stack0x00000010;
  p1 = 0x30;
  p2 = 0x30;
  _logbuffer._len = 0;
  _logbuffer._error = false;
  memset(_logbuffer._buf,0,_logbuffer._total);
  pcVar1 = oonf_log_get_walltime((oonf_walltime_str *)((long)&last + 2));
  __tempptr._4_4_ = abuf_puts(&_logbuffer,pcVar1);
  __tempptr._0_4_ =
       abuf_appendf(&_logbuffer," %s(%s) %s %d: ",LOG_SEVERITY_NAMES[severity],
                    LOG_SOURCE_NAMES[source],file,(ulong)(uint)line);
  abuf_vappendf(&_logbuffer,format,(__va_list_tag *)&p2);
  pcVar1 = _logbuffer._buf + (_logbuffer._len - 1);
  if (hexptr == (void *)0x0) {
    if (*pcVar1 == '\n') {
      *pcVar1 = '\0';
    }
  }
  else {
    if (*pcVar1 != '\n') {
      abuf_puts(&_logbuffer,"\n");
    }
    abuf_hexdump(&_logbuffer,"",hexptr,hexlen);
  }
  tbuf.buf._6_4_ = severity;
  tbuf.buf._10_4_ = source;
  if (_handler_list.next == &_handler_list && _handler_list.prev == &_handler_list) {
    oonf_log_stderr((oonf_log_handler_entry *)0x0,(oonf_log_parameters *)(tbuf.buf + 6));
  }
  else {
    local_e8 = _handler_list.next;
    __tempptr_1 = _handler_list.next;
    iterator = (oonf_log_handler_entry *)_handler_list.next;
    __tempptr_2 = (_handler_list.next)->next;
    local_f8 = __tempptr_2;
    param._32_8_ = __tempptr_2;
    while( true ) {
      local_108 = _handler_list.prev;
      __tempptr_3 = _handler_list.prev;
      if ((iterator->_node).prev == _handler_list.prev) break;
      if ((iterator->_processed_bitmask[source] & severity) != 0) {
        (*iterator->handler)(iterator,(oonf_log_parameters *)(tbuf.buf + 6));
      }
      iterator = (oonf_log_handler_entry *)param._32_8_;
      local_120 = *(undefined8 *)param._32_8_;
      local_118 = local_120;
      param._32_8_ = local_120;
    }
  }
  return;
}

Assistant:

void
oonf_log(enum oonf_log_severity severity, enum oonf_log_source source, const char *file, int line,
  const void *hexptr, size_t hexlen, const char *format, ...) {
  struct oonf_log_handler_entry *h, *iterator;
  struct oonf_log_parameters param;
  struct oonf_walltime_str tbuf;
  char *last;
  va_list ap;
  int p1 = 0, p2 = 0;

  if (severity == LOG_SEVERITY_WARN) {
    /* count warnings */
    _log_warnings[source]++;
    _log_warnings[LOG_ALL]++;
  }

  va_start(ap, format);

  /* generate log string */
  abuf_clear(&_logbuffer);
  p1 = abuf_puts(&_logbuffer, oonf_log_get_walltime(&tbuf));
  p2 = abuf_appendf(&_logbuffer, " %s(%s) %s %d: ", LOG_SEVERITY_NAMES[severity], LOG_SOURCE_NAMES[source], file, line);
  abuf_vappendf(&_logbuffer, format, ap);

  last = &abuf_getptr(&_logbuffer)[abuf_getlen(&_logbuffer) - 1];
  if (hexptr) {
    /* append \n at the end of the line if necessary */
    if (*last != '\n') {
      abuf_puts(&_logbuffer, "\n");
    }

    abuf_hexdump(&_logbuffer, "", hexptr, hexlen);
  }
  else {
    /* remove \n at the end of the line if necessary */
    if (*last == '\n') {
      *last = 0;
    }
  }

  param.severity = severity;
  param.source = source;
  param.file = file;
  param.line = line;
  param.buffer = abuf_getptr(&_logbuffer);
  param.timeLength = p1;
  param.prefixLength = p2;

  /* use stderr logger if nothing has been configured */
  if (list_is_empty(&_handler_list)) {
    oonf_log_stderr(NULL, &param);
  }
  else {
    /* call all log handlers */
    list_for_each_element_safe(&_handler_list, h, _node, iterator) {
      if (oonf_log_mask_test(h->_processed_bitmask, source, severity)) {
        h->handler(h, &param);
      }
    }
  }
  va_end(ap);
}